

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::PluralRuleParser::getNextToken(PluralRuleParser *this,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  tokenType tVar5;
  int iVar6;
  UnicodeString local_60;
  int local_20;
  char16_t local_1a;
  int32_t curIndex;
  UChar ch;
  UErrorCode *status_local;
  PluralRuleParser *this_local;
  
  _curIndex = status;
  status_local = (UErrorCode *)this;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    while (iVar6 = this->ruleIndex, iVar4 = UnicodeString::length(this->ruleSrc), iVar6 < iVar4) {
      local_1a = UnicodeString::charAt(this->ruleSrc,this->ruleIndex);
      tVar5 = charType(local_1a);
      this->type = tVar5;
      if (this->type != tSpace) break;
      this->ruleIndex = this->ruleIndex + 1;
    }
    iVar6 = this->ruleIndex;
    iVar4 = UnicodeString::length(this->ruleSrc);
    if (iVar6 < iVar4) {
      local_20 = this->ruleIndex;
      switch(this->type) {
      case tNumber:
        while( true ) {
          bVar1 = false;
          if (this->type == tNumber) {
            iVar6 = local_20 + 1;
            local_20 = iVar6;
            iVar4 = UnicodeString::length(this->ruleSrc);
            bVar1 = iVar6 < iVar4;
          }
          if (!bVar1) break;
          local_1a = UnicodeString::charAt(this->ruleSrc,local_20);
          tVar5 = charType(local_1a);
          this->type = tVar5;
        }
        this->type = tNumber;
        break;
      case tComma:
      case tSemiColon:
      case tColon:
      case tAt:
      case tEllipsis:
      case tMod:
      case tEqual:
      case tTilde:
        local_20 = local_20 + 1;
        break;
      default:
        *_curIndex = U_FMT_PARSE_ERROR_START;
        local_20 = local_20 + 1;
        break;
      case tDot:
        iVar6 = local_20 + 1;
        iVar4 = UnicodeString::length(this->ruleSrc);
        if ((iVar6 < iVar4) &&
           (cVar3 = UnicodeString::charAt(this->ruleSrc,local_20 + 1), cVar3 == L'.')) {
          iVar6 = local_20 + 2;
          iVar4 = UnicodeString::length(this->ruleSrc);
          if ((iVar6 < iVar4) &&
             (cVar3 = UnicodeString::charAt(this->ruleSrc,local_20 + 2), cVar3 == L'.')) {
            this->type = tEllipsis;
            local_20 = local_20 + 3;
          }
          else {
            local_20 = local_20 + 2;
            this->type = tDot2;
          }
        }
        else {
          local_20 = local_20 + 1;
        }
        break;
      case tKeyword:
        while( true ) {
          bVar1 = false;
          if (this->type == tKeyword) {
            iVar6 = local_20 + 1;
            local_20 = iVar6;
            iVar4 = UnicodeString::length(this->ruleSrc);
            bVar1 = iVar6 < iVar4;
          }
          if (!bVar1) break;
          local_1a = UnicodeString::charAt(this->ruleSrc,local_20);
          tVar5 = charType(local_1a);
          this->type = tVar5;
        }
        this->type = tKeyword;
        break;
      case tNotEqual:
        cVar3 = UnicodeString::charAt(this->ruleSrc,local_20 + 1);
        if (cVar3 == L'=') {
          local_20 = local_20 + 2;
        }
        else {
          this->type = none;
          local_20 = local_20 + 1;
        }
      }
      UnicodeString::UnicodeString
                (&local_60,this->ruleSrc,this->ruleIndex,local_20 - this->ruleIndex);
      UnicodeString::operator=(&this->token,&local_60);
      UnicodeString::~UnicodeString(&local_60);
      this->ruleIndex = local_20;
    }
    else {
      this->type = tEOF;
    }
  }
  return;
}

Assistant:

void
PluralRuleParser::getNextToken(UErrorCode &status)
{
    if (U_FAILURE(status)) {
        return;
    }

    UChar ch;
    while (ruleIndex < ruleSrc->length()) {
        ch = ruleSrc->charAt(ruleIndex);
        type = charType(ch);
        if (type != tSpace) {
            break;
        }
        ++(ruleIndex);
    }
    if (ruleIndex >= ruleSrc->length()) {
        type = tEOF;
        return;
    }
    int32_t curIndex= ruleIndex;

    switch (type) {
      case tColon:
      case tSemiColon:
      case tComma:
      case tEllipsis:
      case tTilde:   // scanned '~'
      case tAt:      // scanned '@'
      case tEqual:   // scanned '='
      case tMod:     // scanned '%'
        // Single character tokens.
        ++curIndex;
        break;

      case tNotEqual:  // scanned '!'
        if (ruleSrc->charAt(curIndex+1) == EQUALS) {
            curIndex += 2;
        } else {
            type = none;
            curIndex += 1;
        }
        break;

      case tKeyword:
         while (type == tKeyword && ++curIndex < ruleSrc->length()) {
             ch = ruleSrc->charAt(curIndex);
             type = charType(ch);
         }
         type = tKeyword;
         break;

      case tNumber:
         while (type == tNumber && ++curIndex < ruleSrc->length()) {
             ch = ruleSrc->charAt(curIndex);
             type = charType(ch);
         }
         type = tNumber;
         break;

       case tDot:
         // We could be looking at either ".." in a range, or "..." at the end of a sample.
         if (curIndex+1 >= ruleSrc->length() || ruleSrc->charAt(curIndex+1) != DOT) {
             ++curIndex;
             break; // Single dot
         }
         if (curIndex+2 >= ruleSrc->length() || ruleSrc->charAt(curIndex+2) != DOT) {
             curIndex += 2;
             type = tDot2;
             break; // double dot
         }
         type = tEllipsis;
         curIndex += 3;
         break;     // triple dot

       default:
         status = U_UNEXPECTED_TOKEN;
         ++curIndex;
         break;
    }

    U_ASSERT(ruleIndex <= ruleSrc->length());
    U_ASSERT(curIndex <= ruleSrc->length());
    token=UnicodeString(*ruleSrc, ruleIndex, curIndex-ruleIndex);
    ruleIndex = curIndex;
}